

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void __thiscall
stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::errcode>
          (base_message<std::allocator<unsigned_char>_> *this,errcode *attr)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = stun_msg_len((stun_msg_hdr *)
                       (this->buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
  sVar2 = strlen(attr->reason_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->buffer_,sVar1 + (sVar2 + 3 & 0xfffffffffffffffc) + 8);
  stun_attr_errcode_add
            ((stun_msg_hdr *)
             (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,attr->status_code_,attr->reason_,attr->pad_);
  return;
}

Assistant:

void push_back(const AttributeType &attr) {
    buffer_.resize(size() + attr.size());
    attr.append(reinterpret_cast<stun_msg_hdr*>(buffer_.data()));
  }